

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_shared_secret(uint8_t *public_key,uint8_t *private_key,uint8_t *secret)

{
  int iVar1;
  cmpresult_t cVar2;
  uECC_word_t uVar3;
  uECC_word_t carry;
  uECC_word_t tries;
  uECC_word_t *initial_Z;
  uECC_word_t random [4];
  uECC_word_t *p2 [2];
  uECC_word_t tmp [4];
  uECC_word_t private [4];
  undefined1 local_a0 [8];
  EccPoint product;
  EccPoint public;
  uint8_t *secret_local;
  uint8_t *private_key_local;
  uint8_t *public_key_local;
  
  random[3] = (uECC_word_t)(tmp + 3);
  p2[0] = (uECC_word_t *)(p2 + 1);
  tries = 0;
  carry = 0;
  public.y[3] = (uECC_word_t)secret;
  do {
    if (0x3f < carry) {
LAB_00120db5:
      vli_bytesToNative(tmp + 3,private_key);
      vli_bytesToNative(product.y + 3,public_key);
      vli_bytesToNative(public.x + 3,public_key + 0x20);
      uVar3 = vli_add(tmp + 3,tmp + 3,curve_n);
      vli_add((uECC_word_t *)(p2 + 1),tmp + 3,curve_n);
      EccPoint_mult((EccPoint *)local_a0,(EccPoint *)(product.y + 3),
                    (uECC_word_t *)random[(long)(int)(uint)((uVar3 != 0 ^ 0xffU) & 1) + 3],
                    (uECC_word_t *)tries,0x101);
      vli_nativeToBytes((uint8_t *)public.y[3],(uint64_t *)local_a0);
      cVar2 = EccPoint_isZero((EccPoint *)local_a0);
      return (int)((cVar2 != 0 ^ 0xffU) & 1);
    }
    iVar1 = (*g_rng_function)((uint8_t *)&initial_Z,0x20);
    if (iVar1 != 0) {
      uVar3 = vli_isZero((uECC_word_t *)&initial_Z);
      if (uVar3 == 0) {
        tries = (uECC_word_t)&initial_Z;
        goto LAB_00120db5;
      }
    }
    carry = carry + 1;
  } while( true );
}

Assistant:

int uECC_shared_secret(const uint8_t public_key[uECC_BYTES*2],
                       const uint8_t private_key[uECC_BYTES],
                       uint8_t secret[uECC_BYTES]) {
    EccPoint public;
    EccPoint product;
    uECC_word_t private[uECC_WORDS];
    uECC_word_t tmp[uECC_WORDS];
    uECC_word_t *p2[2] = {private, tmp};
    uECC_word_t random[uECC_WORDS];
    uECC_word_t *initial_Z = 0;
    uECC_word_t tries;
    uECC_word_t carry;

    // Try to get a random initial Z value to improve protection against side-channel
    // attacks. If the RNG fails every time (eg it was not defined), we continue so that
    // uECC_shared_secret() can still work without an RNG defined.
    for (tries = 0; tries < MAX_TRIES; ++tries) {
        if (g_rng_function((uint8_t *)random, sizeof(random)) && !vli_isZero(random)) {
            initial_Z = random;
            break;
        }
    }

    vli_bytesToNative(private, private_key);
    vli_bytesToNative(public.x, public_key);
    vli_bytesToNative(public.y, public_key + uECC_BYTES);

#if (uECC_CURVE == uECC_secp160r1)
    // Don't regularize the bitcount for secp160r1.
    EccPoint_mult(&product, &public, private, initial_Z, vli_numBits(private, uECC_WORDS));
#else
    // Regularize the bitcount for the private key so that attackers cannot use a side channel
    // attack to learn the number of leading zeros.
    carry = vli_add(private, private, curve_n);
    vli_add(tmp, private, curve_n);
    EccPoint_mult(&product, &public, p2[!carry], initial_Z, (uECC_BYTES * 8) + 1);
#endif

    vli_nativeToBytes(secret, product.x);
    return !EccPoint_isZero(&product);
}